

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

int decode_one(MMDB_s *mmdb,uint32_t offset,MMDB_entry_data_s *entry_data)

{
  byte bVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  uint32_t local_2c;
  
  uVar3 = mmdb->data_section_size;
  uVar9 = uVar3 - 1;
  if (uVar9 < offset) {
    return 7;
  }
  puVar2 = mmdb->data_section;
  entry_data->offset = offset;
  entry_data->has_data = true;
  uVar12 = offset + 1;
  bVar1 = puVar2[offset];
  uVar10 = (uint)bVar1;
  if (bVar1 < 0x20) {
    if (uVar9 < uVar12) {
      return 7;
    }
    uVar8 = puVar2[uVar12] + 7;
    entry_data->type = uVar8;
    uVar12 = offset + 2;
  }
  else {
    uVar8 = (uint)(bVar1 >> 5);
    entry_data->type = uVar8;
    if (uVar8 == 1) {
      uVar8 = bVar1 >> 3 & 3;
      uVar9 = uVar8 + 1;
      if (uVar3 - uVar9 < uVar12 || uVar3 < uVar9) {
        return 7;
      }
      pbVar11 = puVar2 + uVar12;
      switch(uVar8) {
      case 0:
        uVar3 = (uint)*pbVar11 | (uVar10 & 7) << 8;
        break;
      case 1:
        uVar3 = ((uint)*pbVar11 << 8 | (uVar10 & 7) << 0x10) + (uint)pbVar11[1] + 0x800;
        break;
      case 2:
        uVar3 = (uint)(bVar1 & 7) * 0x1000000 +
                ((uint)pbVar11[2] | (uint)pbVar11[1] << 8 | (uint)*pbVar11 << 0x10) + 0x80800;
        break;
      case 3:
        uVar3 = get_uint32(pbVar11);
      }
      (entry_data->field_1).pointer = uVar3;
      entry_data->data_size = uVar9;
      uVar12 = uVar12 + uVar9;
      goto LAB_001034f8;
    }
  }
  uVar10 = uVar10 & 0x1f;
  if (uVar10 == 0x1f) {
    if (uVar3 - 3 < uVar12) {
      return 7;
    }
    uVar10 = (uint)puVar2[(ulong)uVar12 + 2] +
             ((uint)puVar2[(ulong)uVar12 + 1] << 8 | (uint)puVar2[uVar12] << 0x10) + 0x1011d;
    uVar12 = uVar12 + 3;
  }
  else if (uVar10 == 0x1e) {
    if (uVar3 - 2 < uVar12) {
      return 7;
    }
    uVar10 = (ushort)(*(ushort *)(puVar2 + uVar12) << 8 | *(ushort *)(puVar2 + uVar12) >> 8) + 0x11d
    ;
    uVar12 = uVar12 + 2;
  }
  else if (uVar10 == 0x1d) {
    if (uVar9 < uVar12) {
      return 7;
    }
    uVar6 = (ulong)uVar12;
    uVar12 = uVar12 + 1;
    uVar10 = puVar2[uVar6] + 0x1d;
  }
  if (uVar8 == 7) {
LAB_00103443:
    entry_data->data_size = uVar10;
    goto LAB_001034f8;
  }
  if (uVar8 == 0xe) {
    (entry_data->field_1).boolean = uVar10 != 0;
    entry_data->data_size = 0;
    goto LAB_001034f8;
  }
  if (uVar8 == 0xb) goto LAB_00103443;
  if (uVar3 - uVar10 < uVar12 || uVar3 < uVar10) {
    return 7;
  }
  switch(uVar8) {
  case 2:
    puVar4 = "";
    if (uVar10 != 0) {
      puVar4 = puVar2 + uVar12;
    }
    (entry_data->field_1).utf8_string = (char *)puVar4;
    goto LAB_0010352c;
  case 3:
    if (uVar10 != 8) {
      return 7;
    }
    (entry_data->field_1).uint64 =
         CONCAT17(puVar2[uVar12],
                  CONCAT16(puVar2[(ulong)uVar12 + 1],
                           CONCAT15(puVar2[(ulong)uVar12 + 2],
                                    CONCAT14(puVar2[(ulong)uVar12 + 3],
                                             CONCAT13(puVar2[(ulong)uVar12 + 4],
                                                      CONCAT12(puVar2[(ulong)uVar12 + 5],
                                                               CONCAT11(puVar2[(ulong)uVar12 + 6],
                                                                        puVar2[(ulong)uVar12 + 7])))
                                            ))));
    uVar10 = 8;
    break;
  case 4:
    (entry_data->field_1).utf8_string = (char *)(puVar2 + uVar12);
LAB_0010352c:
    entry_data->data_size = uVar10;
    break;
  case 5:
    if (2 < uVar10) {
      return 7;
    }
    uVar5 = get_uintX(puVar2 + uVar12,uVar10);
    (entry_data->field_1).uint16 = (uint16_t)uVar5;
    break;
  case 6:
  case 8:
    if (4 < uVar10) {
      return 7;
    }
    uVar5 = get_uintX(puVar2 + uVar12,uVar10);
    (entry_data->field_1).pointer = (uint32_t)uVar5;
    break;
  case 9:
    if (8 < uVar10) {
      return 7;
    }
    uVar5 = get_uintX(puVar2 + uVar12,uVar10);
    (entry_data->field_1).uint64 = uVar5;
    break;
  case 10:
    if (0x10 < uVar10) {
      return 7;
    }
    pbVar11 = puVar2 + uVar12;
    uVar6 = 0;
    uVar7 = 0;
    for (uVar9 = uVar10; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      uVar7 = uVar7 << 8 | uVar6 >> 0x38;
      bVar1 = *pbVar11;
      pbVar11 = pbVar11 + 1;
      uVar6 = uVar6 << 8 | (ulong)bVar1;
    }
    (entry_data->field_1).uint64 = uVar6;
    *(ulong *)((long)&entry_data->field_1 + 8) = uVar7;
    break;
  case 0xf:
    if (uVar10 != 4) {
      return 7;
    }
    local_2c = CONCAT31(CONCAT21(CONCAT11(puVar2[uVar12],puVar2[(ulong)uVar12 + 1]),
                                 puVar2[(ulong)uVar12 + 2]),puVar2[(ulong)uVar12 + 3]);
    (entry_data->field_1).pointer = local_2c;
    uVar10 = 4;
  }
  uVar12 = uVar12 + uVar10;
LAB_001034f8:
  entry_data->offset_to_next = uVar12;
  return 0;
}

Assistant:

static int decode_one(const MMDB_s *const mmdb,
                      uint32_t offset,
                      MMDB_entry_data_s *entry_data) {
    const uint8_t *mem = mmdb->data_section;

    // We subtract rather than add as it possible that offset + 1
    // could overflow for a corrupt database while an underflow
    // from data_section_size - 1 should not be possible.
    if (offset > mmdb->data_section_size - 1) {
        DEBUG_MSGF("Offset (%d) past data section (%d)",
                   offset,
                   mmdb->data_section_size);
        return MMDB_INVALID_DATA_ERROR;
    }

    entry_data->offset = offset;
    entry_data->has_data = true;

    DEBUG_NL;
    DEBUG_MSGF("Offset: %i", offset);

    uint8_t ctrl = mem[offset++];
    DEBUG_BINARY("Control byte: %s", ctrl);

    int type = (ctrl >> 5) & 7;
    DEBUG_MSGF("Type: %i (%s)", type, type_num_to_name(type));

    if (type == MMDB_DATA_TYPE_EXTENDED) {
        // Subtracting 1 to avoid possible overflow on offset + 1
        if (offset > mmdb->data_section_size - 1) {
            DEBUG_MSGF("Extended type offset (%d) past data section (%d)",
                       offset,
                       mmdb->data_section_size);
            return MMDB_INVALID_DATA_ERROR;
        }
        type = get_ext_type(mem[offset++]);
        DEBUG_MSGF("Extended type: %i (%s)", type, type_num_to_name(type));
    }

    entry_data->type = (uint32_t)type;

    if (type == MMDB_DATA_TYPE_POINTER) {
        uint8_t psize = ((ctrl >> 3) & 3) + 1;
        DEBUG_MSGF("Pointer size: %i", psize);

        // We check that the offset does not extend past the end of the
        // database and that the subtraction of psize did not underflow.
        if (offset > mmdb->data_section_size - psize ||
            mmdb->data_section_size < psize) {
            DEBUG_MSGF("Pointer offset (%d) past data section (%d)",
                       offset + psize,
                       mmdb->data_section_size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->pointer = get_ptr_from(ctrl, &mem[offset], psize);
        DEBUG_MSGF("Pointer to: %i", entry_data->pointer);

        entry_data->data_size = psize;
        entry_data->offset_to_next = offset + psize;
        return MMDB_SUCCESS;
    }

    uint32_t size = ctrl & 31;
    switch (size) {
        case 29:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 1) {
                DEBUG_MSGF("String end (%d, case 29) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 29 + mem[offset++];
            break;
        case 30:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 2) {
                DEBUG_MSGF("String end (%d, case 30) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 285 + get_uint16(&mem[offset]);
            offset += 2;
            break;
        case 31:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 3) {
                DEBUG_MSGF("String end (%d, case 31) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 65821 + get_uint24(&mem[offset]);
            offset += 3;
            break;
        default:
            break;
    }

    DEBUG_MSGF("Size: %i", size);

    if (type == MMDB_DATA_TYPE_MAP || type == MMDB_DATA_TYPE_ARRAY) {
        entry_data->data_size = size;
        entry_data->offset_to_next = offset;
        return MMDB_SUCCESS;
    }

    if (type == MMDB_DATA_TYPE_BOOLEAN) {
        entry_data->boolean = size ? true : false;
        entry_data->data_size = 0;
        entry_data->offset_to_next = offset;
        DEBUG_MSGF("boolean value: %s", entry_data->boolean ? "true" : "false");
        return MMDB_SUCCESS;
    }

    // Check that the data doesn't extend past the end of the memory
    // buffer and that the calculation in doing this did not underflow.
    if (offset > mmdb->data_section_size - size ||
        mmdb->data_section_size < size) {
        DEBUG_MSGF("Data end (%d) past data section (%d)",
                   offset + size,
                   mmdb->data_section_size);
        return MMDB_INVALID_DATA_ERROR;
    }

    if (type == MMDB_DATA_TYPE_UINT16) {
        if (size > 2) {
            DEBUG_MSGF("uint16 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint16 = (uint16_t)get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint16 value: %u", entry_data->uint16);
    } else if (type == MMDB_DATA_TYPE_UINT32) {
        if (size > 4) {
            DEBUG_MSGF("uint32 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint32 = (uint32_t)get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint32 value: %u", entry_data->uint32);
    } else if (type == MMDB_DATA_TYPE_INT32) {
        if (size > 4) {
            DEBUG_MSGF("int32 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->int32 = get_sintX(&mem[offset], (int)size);
        DEBUG_MSGF("int32 value: %i", entry_data->int32);
    } else if (type == MMDB_DATA_TYPE_UINT64) {
        if (size > 8) {
            DEBUG_MSGF("uint64 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint64 = get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint64 value: %" PRIu64, entry_data->uint64);
    } else if (type == MMDB_DATA_TYPE_UINT128) {
        if (size > 16) {
            DEBUG_MSGF("uint128 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
#if MMDB_UINT128_IS_BYTE_ARRAY
        memset(entry_data->uint128, 0, 16);
        if (size > 0) {
            memcpy(entry_data->uint128 + 16 - size, &mem[offset], size);
        }
#else
        entry_data->uint128 = get_uint128(&mem[offset], (int)size);
#endif
    } else if (type == MMDB_DATA_TYPE_FLOAT) {
        if (size != 4) {
            DEBUG_MSGF("float of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        size = 4;
        entry_data->float_value = get_ieee754_float(&mem[offset]);
        DEBUG_MSGF("float value: %f", entry_data->float_value);
    } else if (type == MMDB_DATA_TYPE_DOUBLE) {
        if (size != 8) {
            DEBUG_MSGF("double of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        size = 8;
        entry_data->double_value = get_ieee754_double(&mem[offset]);
        DEBUG_MSGF("double value: %f", entry_data->double_value);
    } else if (type == MMDB_DATA_TYPE_UTF8_STRING) {
        entry_data->utf8_string = size == 0 ? "" : (char const *)&mem[offset];
        entry_data->data_size = size;
#ifdef MMDB_DEBUG
        char *string =
            mmdb_strndup(entry_data->utf8_string, size > 50 ? 50 : size);
        if (NULL == string) {
            abort();
        }
        DEBUG_MSGF("string value: %s", string);
        free(string);
#endif
    } else if (type == MMDB_DATA_TYPE_BYTES) {
        entry_data->bytes = &mem[offset];
        entry_data->data_size = size;
    }

    entry_data->offset_to_next = offset + size;

    return MMDB_SUCCESS;
}